

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerStream.cpp
# Opt level: O1

WorkerFlow * __thiscall
WorkerStream::create_flow(WorkerStream *this,string *name,string *connect,int port,size_t buffsize)

{
  pointer pcVar1;
  WorkerFlow *this_00;
  mapped_type pWVar2;
  mapped_type *ppWVar3;
  string local_50;
  
  this_00 = (WorkerFlow *)operator_new(0x38);
  pcVar1 = (connect->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + connect->_M_string_length);
  WorkerFlow::WorkerFlow(this_00,&local_50,port,buffsize);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pWVar2 = (mapped_type)operator_new(0x10);
  pWVar2->flow = this_00;
  pWVar2->stopped = false;
  ppWVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorkerWrapper_*>_>_>
            ::operator[](&this->m_flows,name);
  *ppWVar3 = pWVar2;
  return this_00;
}

Assistant:

WorkerFlow * WorkerStream::create_flow(std::string name, std::string connect, int port,
    size_t buffsize)
{
    // create the flow.
    WorkerFlow * flow = new WorkerFlow(connect, port, buffsize);

    // wrap the flow with additional meta-data.
    WorkerWrapper * wd = new WorkerWrapper;
    wd->flow = flow;
    wd->stopped = false;

    // register the flow.
    m_flows[name] = wd;

    return flow;
}